

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O0

QcFile * qc_file_open(char *pathname,int oflag)

{
  int iVar1;
  int mode;
  QcFile *file;
  int oflag_local;
  char *pathname_local;
  
  if (pathname == (char *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
            ,0x31);
    __assert_fail("pathname",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                  ,0x31,"QcFile *qc_file_open(const char *, int)");
  }
  pathname_local = (char *)malloc(4);
  if ((int *)pathname_local == (int *)0x0) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
              ,0x35,"file hdl malloc failed");
    pathname_local = (char *)0x0;
  }
  else {
    if ((oflag & 0x40U) == 0) {
      iVar1 = open(pathname,oflag);
      *(int *)pathname_local = iVar1;
    }
    else {
      iVar1 = open(pathname,oflag,0x1c0);
      *(int *)pathname_local = iVar1;
    }
    if (*(int *)pathname_local == -1) {
      _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                 ,0x44,"file(pathname) open failed",pathname);
      pathname_local = (char *)0x0;
    }
  }
  return (QcFile *)pathname_local;
}

Assistant:

QcFile* qc_file_open(const char *pathname, int oflag)
{
    QcFile *file;
    int mode;

    qc_assert(pathname);

    if(NULL == (file = malloc(sizeof(QcFile))))
    {
        qc_error("file hdl malloc failed");
        return NULL;
    }

    if(O_CREAT & oflag)
    {
        file->filedes = open(pathname, oflag, S_IRUSR|S_IWUSR|S_IXUSR);
    }
    else
    {
        file->filedes = open(pathname, oflag);
    }

    if(-1 == file->filedes)
    {
        qc_perror("file(pathname) open failed", pathname);
        return NULL;
    }

    return file;
}